

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

void __thiscall embree::BVHN<4>::layoutLargeNodes(BVHN<4> *this,size_t num)

{
  NodeArea *pNVar1;
  ulong uVar2;
  NodeRef *pNVar3;
  ulong *puVar4;
  long *plVar5;
  ThreadLocal2 *this_00;
  NodeRef NVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_t i;
  float fVar12;
  float fVar13;
  vector<NodeArea,_std::allocator<NodeArea>_> lst;
  Lock<embree::MutexSys> lock;
  vector<NodeArea,_std::allocator<NodeArea>_> local_88;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_68;
  undefined1 local_60 [8];
  ThreadLocal *pTStack_58;
  ThreadLocal *local_50;
  NodeRef *local_48;
  undefined8 *local_40;
  undefined1 local_38;
  
  local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data.
  _M_start = (NodeArea *)0x0;
  local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data.
  _M_finish = (NodeArea *)0x0;
  local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (NodeArea *)0x0;
  std::vector<NodeArea,_std::allocator<NodeArea>_>::reserve(&local_88,num);
  local_48 = &this->root;
  pTStack_58 = (ThreadLocal *)
               CONCAT44(pTStack_58._4_4_,
                        *(float *)(&DAT_01f86008 + (ulong)(((this->root).ptr & 8) == 0) * 4));
  local_60 = (undefined1  [8])local_48;
  if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
    ::_M_realloc_insert<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>
              ((vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
                *)&local_88,
               (iterator)
               local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish,(NodeArea *)local_60);
  }
  else {
    (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
     super__Vector_impl_data._M_finish)->node = local_48;
    *(ThreadLocal **)
     &(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
       super__Vector_impl_data._M_finish)->A = pTStack_58;
    local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
  }
  lVar7 = (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((ulong)(lVar7 >> 4) < num) {
    do {
      if (0x10 < lVar7) {
        pNVar3 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].node;
        fVar13 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].A;
        local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].node =
             (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
              super__Vector_impl_data._M_start)->node;
        local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].A =
             (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
              super__Vector_impl_data._M_start)->A;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea*,std::vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>>,long,embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,__gnu_cxx::__ops::_Iter_less_iter>
                  (fVar13,local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                          super__Vector_impl_data._M_start,0,
                   (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                   (-0x10 - (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4,pNVar3);
      }
      pNVar1 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      uVar9 = pNVar1->node->ptr;
      if ((uVar9 & 0xf) != 0) break;
      lVar7 = 0;
      do {
        if (*(long *)(uVar9 + lVar7 * 8) != 8) {
          local_60 = (undefined1  [8])(lVar7 * 8 + uVar9);
          fVar13 = -INFINITY;
          if (((ulong)((FastAllocator *)local_60)->device & 8) == 0) {
            fVar13 = *(float *)(uVar9 + 0x50 + lVar7 * 4) - *(float *)(uVar9 + 0x40 + lVar7 * 4);
            fVar12 = *(float *)(uVar9 + 0x70 + lVar7 * 4) - *(float *)(uVar9 + 0x60 + lVar7 * 4);
            fVar13 = (fVar13 + fVar12) *
                     (*(float *)(uVar9 + 0x30 + lVar7 * 4) - *(float *)(uVar9 + 0x20 + lVar7 * 4)) +
                     fVar12 * fVar13;
            fVar13 = fVar13 + fVar13;
          }
          pTStack_58 = (ThreadLocal *)CONCAT44(pTStack_58._4_4_,fVar13);
          if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
            ::_M_realloc_insert<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>
                      ((vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
                        *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                       super__Vector_impl_data._M_finish,(NodeArea *)local_60);
          }
          else {
            (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
             super__Vector_impl_data._M_finish)->node = (NodeRef *)local_60;
            *(ThreadLocal **)
             &(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
               super__Vector_impl_data._M_finish)->A = pTStack_58;
            local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pNVar3 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].node;
          fVar13 = local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].A;
          lVar10 = (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                         super__Vector_impl_data._M_start >> 4;
          uVar8 = lVar10 - 1;
          if (1 < lVar10) {
            do {
              uVar2 = uVar8 - 1;
              uVar11 = uVar2 >> 1;
              if (fVar13 < local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar11].A ||
                  fVar13 == local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar11].A) goto LAB_00b79725;
              local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8].A =
                   local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11].A;
              local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8].node =
                   local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11].node;
              uVar8 = uVar11;
            } while (1 < uVar2);
            uVar8 = 0;
          }
LAB_00b79725:
          local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8].node = pNVar3;
          local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8].A = fVar13;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar7 = (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                    super__Vector_impl_data._M_start;
    } while ((ulong)(lVar7 >> 4) < num);
  }
  if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      puVar4 = *(ulong **)
                ((long)&(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                         super__Vector_impl_data._M_start)->node + lVar7);
      *puVar4 = *puVar4 | 0x8000000000000000;
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar9 < (ulong)((long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  plVar5 = (long *)__tls_get_addr(&PTR_021a7d38);
  pNVar3 = local_48;
  this_00 = (ThreadLocal2 *)*plVar5;
  if (this_00 == (ThreadLocal2 *)0x0) {
    this_00 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_00);
    (this_00->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_00->alloc0).parent = this_00;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc1).parent = this_00;
    (this_00->alloc1).ptr = (char *)0x0;
    (this_00->alloc1).cur = 0;
    (this_00->alloc1).end = 0;
    (this_00->alloc1).allocBlockSize = 0;
    (this_00->alloc1).bytesUsed = 0;
    (this_00->alloc1).bytesWasted = 0;
    *plVar5 = (long)this_00;
    local_40 = &FastAllocator::s_thread_local_allocators_lock;
    local_38 = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_68._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_68);
    if (local_68._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_68,
                 local_68._M_head_impl);
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
  }
  local_60 = (undefined1  [8])&this->alloc;
  pTStack_58 = &this_00->alloc0;
  local_50 = &this_00->alloc1;
  if ((this->alloc).use_single_mode != false) {
    local_50 = pTStack_58;
  }
  NVar6 = layoutLargeNodesRecursion(this,pNVar3,(CachedAllocator *)local_60);
  pNVar3->ptr = NVar6.ptr;
  if (local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeArea *)0x0) {
    ::operator_delete(local_88.super__Vector_base<NodeArea,_std::allocator<NodeArea>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BVHN<N>::layoutLargeNodes(size_t num)
  {
#if defined(__64BIT__) // do not use tree rotations on 32 bit platforms, barrier bit in NodeRef will cause issues
    struct NodeArea 
    {
      __forceinline NodeArea() {}

      __forceinline NodeArea(NodeRef& node, const BBox3fa& bounds)
        : node(&node), A(node.isLeaf() ? float(neg_inf) : area(bounds)) {}

      __forceinline bool operator< (const NodeArea& other) const {
        return this->A < other.A;
      }

      NodeRef* node;
      float A;
    };
    std::vector<NodeArea> lst;
    lst.reserve(num);
    lst.push_back(NodeArea(root,empty));

    while (lst.size() < num)
    {
      std::pop_heap(lst.begin(), lst.end());
      NodeArea n = lst.back(); lst.pop_back();
      if (!n.node->isAABBNode()) break;
      AABBNode* node = n.node->getAABBNode();
      for (size_t i=0; i<N; i++) {
        if (node->child(i) == BVHN::emptyNode) continue;
        lst.push_back(NodeArea(node->child(i),node->bounds(i)));
        std::push_heap(lst.begin(), lst.end());
      }
    }

    for (size_t i=0; i<lst.size(); i++)
      lst[i].node->setBarrier();
      
    root = layoutLargeNodesRecursion(root,alloc.getCachedAllocator());
#endif
  }